

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall
Constructor::markSubtableOperands(Constructor *this,vector<int,_std::allocator<int>_> *check)

{
  pointer ppOVar1;
  TripleSymbol *pTVar2;
  int iVar3;
  int4 i;
  ulong uVar4;
  
  std::vector<int,_std::allocator<int>_>::resize
            (check,(long)(this->operands).
                         super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->operands).
                         super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3);
  for (uVar4 = 0;
      ppOVar1 = (this->operands).
                super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->operands).
                            super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3);
      uVar4 = uVar4 + 1) {
    pTVar2 = ppOVar1[uVar4]->triple;
    iVar3 = 2;
    if (pTVar2 != (TripleSymbol *)0x0) {
      iVar3 = (*(pTVar2->super_SleighSymbol)._vptr_SleighSymbol[2])();
      iVar3 = (uint)(iVar3 != 0xb) * 2;
    }
    (check->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [uVar4] = iVar3;
  }
  return;
}

Assistant:

void Constructor::markSubtableOperands(vector<int4> &check) const

{ // Adjust -check- so it has one entry for every operand, a 0 if it is a subtable, a 2 if it is not
  check.resize(operands.size());
  for(int4 i=0;i<operands.size();++i) {
    TripleSymbol *sym = operands[i]->getDefiningSymbol();
    if ((sym != (TripleSymbol *)0)&&(sym->getType() == SleighSymbol::subtable_symbol))
      check[i] = 0;
    else
      check[i] = 2;
  }
}